

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O0

bool nv::ImageIO::saveFloat
               (char *fileName,FloatImage *fimage,uint base_component,uint num_components)

{
  bool bVar1;
  int iVar2;
  Image *pIVar3;
  AutoPtr<nv::Image> local_38;
  AutoPtr<nv::Image> image;
  char *extension;
  uint num_components_local;
  uint base_component_local;
  FloatImage *fimage_local;
  char *fileName_local;
  
  image.m_ptr = (Image *)Path::extension(fileName);
  if ((num_components == 3) || (num_components == 4)) {
    pIVar3 = FloatImage::createImage(fimage,base_component,num_components);
    AutoPtr<nv::Image>::AutoPtr(&local_38,pIVar3);
    bVar1 = nv::operator!=(&local_38,(Image *)0x0);
    if ((!bVar1) &&
       (iVar2 = nvAbort("image != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                        ,199,
                        "bool nv::ImageIO::saveFloat(const char *, const FloatImage *, uint, uint)")
       , iVar2 == 1)) {
      raise(5);
    }
    if (num_components == 4) {
      pIVar3 = AutoPtr<nv::Image>::operator->(&local_38);
      Image::setFormat(pIVar3,Format_ARGB);
    }
    pIVar3 = AutoPtr<nv::Image>::ptr(&local_38);
    fileName_local._7_1_ = save(fileName,pIVar3);
    AutoPtr<nv::Image>::~AutoPtr(&local_38);
  }
  else {
    fileName_local._7_1_ = false;
  }
  return fileName_local._7_1_;
}

Assistant:

bool nv::ImageIO::saveFloat(const char * fileName, const FloatImage * fimage, uint base_component, uint num_components)
{
	const char * extension = Path::extension(fileName);

#if defined(HAVE_OPENEXR)
	if (strCaseCmp(extension, ".exr") == 0)
	{
		return ImageIO::saveFloatEXR(fileName, fimage, base_component, num_components);
	}
#endif

#if defined(HAVE_TIFF)
	if (strCaseCmp(extension, ".tif") == 0 || strCaseCmp(extension, ".tiff") == 0)
	{
		return ImageIO::saveFloatTIFF(fileName, fimage, base_component, num_components);
	}
#endif

/* // @@ Disable Temporarily
	if (strCaseCmp(extension, ".pfm") == 0)
	{
//		return ImageIO::saveFloatPFM(fileName, fimage, base_component, num_components);
	}
*/

	if (num_components == 3 || num_components == 4)
	{
		AutoPtr<Image> image(fimage->createImage(base_component, num_components));
		nvCheck(image != NULL);

		if (num_components == 4)
		{
			image->setFormat(Image::Format_ARGB);
		}

		return ImageIO::save(fileName, image.ptr());
	}

	return false;
}